

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

uint64_t pull_le64(uchar **cursor,size_t *max)

{
  ulong __n;
  uint64_t *__src;
  size_t sVar1;
  leint64_t lev;
  uint64_t local_20;
  
  __n = *max;
  __src = (uint64_t *)*cursor;
  if (__n < 8) {
    memcpy(&local_20,__src,__n);
    sVar1 = 0;
    memset((void *)((long)&local_20 + __n),0,8 - __n);
    *cursor = (uchar *)0x0;
  }
  else {
    local_20 = *__src;
    *cursor = (uchar *)(__src + 1);
    sVar1 = __n - 8;
  }
  *max = sVar1;
  return local_20;
}

Assistant:

uint64_t pull_le64(const unsigned char **cursor, size_t *max)
{
    leint64_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le64_to_cpu(lev);
}